

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O1

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::compile_ite_expression
          (rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
           *this,typed_expression_t *cond,typed_expression_t *then_value,
          typed_expression_t *else_value)

{
  vector<long,_std::allocator<long>_> *pvVar1;
  iterator iVar2;
  vector<long,std::allocator<long>> *pvVar3;
  size_type sVar4;
  size_type sVar5;
  size_type *psVar6;
  vector<long,_std::allocator<long>_> else_bytecode;
  vector<long,_std::allocator<long>_> then_bytecode;
  size_type local_a0;
  vector<long,_std::allocator<long>_> local_98;
  vector<long,_std::allocator<long>_> local_80;
  vector<long,_std::allocator<long>_> local_68;
  vector<long,_std::allocator<long>_> local_48;
  
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar4 = compile_tmp_rvalue_expression(then_value,&local_48);
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  sVar5 = compile_tmp_rvalue_expression(else_value,&local_68);
  (**(code **)(*(long *)cond + 0x30))(cond,this);
  local_a0 = 4;
  pvVar1 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar1,iVar2,(long *)&local_a0);
  }
  else {
    *iVar2._M_current = 4;
    (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  local_a0 = sVar4 + 2;
  pvVar1 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar1,iVar2,(long *)&local_a0);
  }
  else {
    *iVar2._M_current = local_a0;
    (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  std::vector<long,_std::allocator<long>_>::vector(&local_80,&local_48);
  if (local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    psVar6 = (size_type *)
             local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_a0 = *psVar6;
      pvVar3 = (vector<long,std::allocator<long>> *)(this->_bytecode_back_inserter).container;
      iVar2._M_current = *(long **)(pvVar3 + 8);
      if (iVar2._M_current == *(long **)(pvVar3 + 0x10)) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  (pvVar3,iVar2,(long *)&local_a0);
      }
      else {
        *iVar2._M_current = local_a0;
        *(long **)(pvVar3 + 8) = iVar2._M_current + 1;
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != (size_type *)
                       local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if ((size_type *)
      local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (size_type *)0x0) {
    operator_delete(local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_a0 = 3;
  pvVar1 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar1,iVar2,(long *)&local_a0);
  }
  else {
    *iVar2._M_current = 3;
    (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  pvVar1 = (this->_bytecode_back_inserter).container;
  iVar2._M_current =
       (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  local_a0 = sVar5;
  if (iVar2._M_current ==
      (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
              (pvVar1,iVar2,(long *)&local_a0);
  }
  else {
    *iVar2._M_current = sVar5;
    (pvVar1->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar2._M_current + 1;
  }
  std::vector<long,_std::allocator<long>_>::vector(&local_98,&local_68);
  if (local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    psVar6 = (size_type *)
             local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      local_a0 = *psVar6;
      pvVar3 = (vector<long,std::allocator<long>> *)(this->_bytecode_back_inserter).container;
      iVar2._M_current = *(long **)(pvVar3 + 8);
      if (iVar2._M_current == *(long **)(pvVar3 + 0x10)) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  (pvVar3,iVar2,(long *)&local_a0);
      }
      else {
        *iVar2._M_current = local_a0;
        *(long **)(pvVar3 + 8) = iVar2._M_current + 1;
      }
      psVar6 = psVar6 + 1;
    } while (psVar6 != (size_type *)
                       local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if ((size_type *)
      local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (size_type *)0x0) {
    operator_delete(local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void compile_ite_expression(tchecker::typed_expression_t const & cond, tchecker::typed_expression_t const & then_value,
                              tchecker::typed_expression_t const & else_value)
  {
    // pre-compute 'then' and 'else' bytecodes
    std::vector<tchecker::bytecode_t> then_bytecode;
    auto then_len = compile_tmp_rvalue_expression(then_value, then_bytecode);

    std::vector<tchecker::bytecode_t> else_bytecode;
    auto else_len = compile_tmp_rvalue_expression(else_value, else_bytecode);

    // generation of ite bytecode
    //  - insert guard bytecode
    cond.visit(*this);

    //  - insert a conditional jump over 'then' bytecode. Jump instruction
    //    move IP relatively to the address following the JMP.
    _bytecode_back_inserter = tchecker::VM_JMPZ;
    _bytecode_back_inserter = then_len + 2;

    //  - insert bytecode for the 'then' statement
    append_bytecode(_bytecode_back_inserter, then_bytecode);

    //  - insert a jump over 'else' bytecode.
    _bytecode_back_inserter = tchecker::VM_JMP;
    _bytecode_back_inserter = else_len;

    //  - insert bytecode for the 'else' statement
    append_bytecode(_bytecode_back_inserter, else_bytecode);
  }